

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  LuaType LVar1;
  ushort uVar2;
  Table *t_00;
  GCObject *pGVar3;
  RaviArray *pRVar4;
  int iVar5;
  Value in_RAX;
  TValue *slot;
  ulong uVar6;
  char *pcVar7;
  Value VVar8;
  lua_Number value;
  lua_Integer i;
  Value local_28;
  
  LVar1 = t->tt_;
  if (LVar1 != 0x8005) {
    if (LVar1 == 0x8025) {
      pRVar4 = (RaviArray *)(t->value_).gc;
      if ((pRVar4->tt == '\x15') || (pRVar4->tt == '%')) {
        if (key->tt_ != 0x13) {
LAB_00126ce7:
          luaG_typeerror(L,key,"index");
        }
        if (val->tt_ == 0x13) {
          uVar6 = (key->value_).i & 0xffffffff;
          if (pRVar4->len <= (uint)(key->value_).b) {
            value = (lua_Number)(val->value_).i;
LAB_00126c3b:
            raviH_set_float(L,pRVar4,uVar6,value);
            return;
          }
          VVar8.n = (lua_Number)(val->value_).i;
        }
        else {
          if (val->tt_ != 3) {
            pcVar7 = "value cannot be converted to number";
            local_28 = in_RAX;
LAB_00126d12:
            luaG_runerror(L,pcVar7);
          }
          uVar6 = (key->value_).i & 0xffffffff;
          if (pRVar4->len <= (uint)(key->value_).b) {
            value = (val->value_).n;
            goto LAB_00126c3b;
          }
          VVar8 = val->value_;
        }
        *(Value *)(pRVar4->data + uVar6 * 8) = VVar8;
        return;
      }
    }
    else {
      if (LVar1 != 0x8015) {
        slot = (TValue *)0x0;
        goto LAB_00126b42;
      }
      pRVar4 = (RaviArray *)(t->value_).gc;
      if ((pRVar4->tt == '\x15') || (pRVar4->tt == '%')) {
        if (key->tt_ == 0x13) {
          if (val->tt_ == 0x13) {
            uVar6 = (key->value_).i & 0xffffffff;
            if (pRVar4->len <= (uint)(key->value_).b) {
              raviH_set_int(L,pRVar4,uVar6,(val->value_).i);
              return;
            }
            pcVar7 = pRVar4->data;
            local_28 = val->value_;
          }
          else {
            local_28.gc = (GCObject *)0x0;
            iVar5 = luaV_tointegerns(val,&local_28.i,F2Ieq);
            if (iVar5 == 0) {
              pcVar7 = "value cannot be converted to integer";
              goto LAB_00126d12;
            }
            uVar6 = (key->value_).i & 0xffffffff;
            if (pRVar4->len <= (uint)(key->value_).b) {
              raviH_set_int(L,pRVar4,uVar6,local_28.i);
              return;
            }
            pcVar7 = pRVar4->data;
          }
          *(Value *)(pcVar7 + uVar6 * 8) = local_28;
          return;
        }
        goto LAB_00126ce7;
      }
    }
    pcVar7 = 
    "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
    ;
    goto LAB_00126ccf;
  }
  if (key->tt_ == 0x13) {
    t_00 = (Table *)(t->value_).gc;
    if (t_00->tt != '\x05') {
LAB_00126cb6:
      pcVar7 = "(((t)->value_).gc)->tt == 5";
      goto LAB_00126ccf;
    }
    uVar6 = (key->value_).i - 1;
    if (uVar6 < t_00->sizearray) {
      slot = t_00->array + uVar6;
    }
    else {
      slot = luaH_getint(t_00,(key->value_).i);
    }
  }
  else {
    if (((Table *)(t->value_).gc)->tt != '\x05') goto LAB_00126cb6;
    slot = luaH_get((Table *)(t->value_).gc,key);
  }
  if (slot->tt_ == 0) {
LAB_00126b42:
    luaV_finishset(L,t,key,val,slot);
    return;
  }
  pGVar3 = (val->value_).gc;
  (slot->value_).gc = pGVar3;
  uVar2 = val->tt_;
  slot->tt_ = uVar2;
  if (-1 < (short)uVar2) {
    return;
  }
  if (((uVar2 & 0x7f) == (ushort)pGVar3->tt) &&
     ((L == (lua_State *)0x0 || ((pGVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
    if ((short)t->tt_ < 0) {
      if ((((t->value_).gc)->marked & 0x20) == 0) {
        return;
      }
      if ((((val->value_).gc)->marked & 0x18) == 0) {
        return;
      }
      luaC_barrierback_(L,(t->value_).gc);
      return;
    }
    pcVar7 = "(((t)->tt_) & (1 << 15))";
  }
  else {
    pcVar7 = "0";
  }
LAB_00126ccf:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE(L, t, key, val);
}